

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void anon_unknown.dwarf_d0ed4::ArchiveError(char *m1,archive *a)

{
  char *pcVar1;
  char *m2;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string message;
  archive *a_local;
  char *m1_local;
  
  message.field_2._8_8_ = a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,m1,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = archive_error_string((archive *)message.field_2._8_8_);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)local_38,pcVar1);
  }
  cmSystemTools::Error((string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ArchiveError(const char* m1, struct archive* a)
{
  std::string message(m1);
  const char* m2 = archive_error_string(a);
  if (m2) {
    message += m2;
  }
  cmSystemTools::Error(message);
}